

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::JsonCodec::AnnotatedHandler> * __thiscall
kj::Own<capnp::JsonCodec::AnnotatedHandler>::operator=
          (Own<capnp::JsonCodec::AnnotatedHandler> *this,
          Own<capnp::JsonCodec::AnnotatedHandler> *other)

{
  Disposer *this_00;
  AnnotatedHandler *object;
  AnnotatedHandler *ptrCopy;
  Disposer *disposerCopy;
  Own<capnp::JsonCodec::AnnotatedHandler> *other_local;
  Own<capnp::JsonCodec::AnnotatedHandler> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (AnnotatedHandler *)0x0;
  if (object != (AnnotatedHandler *)0x0) {
    Disposer::dispose<capnp::JsonCodec::AnnotatedHandler>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }